

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTF.cpp
# Opt level: O1

ConversionResult
llvm::ConvertUTF8toUTF16
          (UTF8 **sourceStart,UTF8 *sourceEnd,UTF16 **targetStart,UTF16 *targetEnd,
          ConversionFlags flags)

{
  byte bVar1;
  bool bVar2;
  Boolean BVar3;
  ConversionResult CVar4;
  ConversionResult CVar5;
  uint length;
  UTF16 *pUVar6;
  uint uVar7;
  byte *source;
  
  source = *sourceStart;
  pUVar6 = *targetStart;
  CVar4 = conversionOK;
  do {
    CVar5 = CVar4;
    if (sourceEnd <= source) break;
    bVar1 = trailingBytesForUTF8[*source];
    uVar7 = (int)(char)bVar1 & 0xffff;
    if ((long)(ulong)uVar7 < (long)sourceEnd - (long)source) {
      length = uVar7 + 1;
      BVar3 = isLegalUTF8(source,length);
      CVar5 = sourceIllegal;
      bVar2 = false;
      if (BVar3 != '\0') {
        if ((byte)uVar7 < 6) {
          CVar4 = (*(code *)(&DAT_002137e0 + *(int *)(&DAT_002137e0 + (ulong)bVar1 * 4)))();
          return CVar4;
        }
        if (targetEnd <= pUVar6) {
LAB_001c7fdf:
          source = source + -(ulong)length;
          CVar5 = targetExhausted;
          goto LAB_001c7feb;
        }
        uVar7 = -*(int *)(offsetsFromUTF8 + (ulong)uVar7 * 4);
        if (uVar7 < 0x10000) {
          if ((uVar7 & 0xf800) == 0xd800) {
LAB_001c7f88:
            if (flags == strictConversion) {
              source = source + -(ulong)length;
              goto LAB_001c7feb;
            }
            *pUVar6 = 0xfffd;
          }
          else {
            *pUVar6 = (ushort)uVar7;
          }
          pUVar6 = pUVar6 + 1;
        }
        else {
          if (0x10ffff < uVar7) goto LAB_001c7f88;
          if (targetEnd <= pUVar6 + 1) goto LAB_001c7fdf;
          *pUVar6 = (short)(uVar7 + 0x3ff0000 >> 10) + 0xd800;
          pUVar6[1] = (ushort)uVar7 & 0x3ff | 0xdc00;
          pUVar6 = pUVar6 + 2;
        }
        bVar2 = true;
        CVar5 = CVar4;
      }
    }
    else {
      CVar5 = sourceExhausted;
LAB_001c7feb:
      bVar2 = false;
    }
    CVar4 = CVar5;
  } while (bVar2);
  *sourceStart = source;
  *targetStart = pUVar6;
  return CVar5;
}

Assistant:

ConversionResult ConvertUTF8toUTF16 (
        const UTF8** sourceStart, const UTF8* sourceEnd,
        UTF16** targetStart, UTF16* targetEnd, ConversionFlags flags) {
    ConversionResult result = conversionOK;
    const UTF8* source = *sourceStart;
    UTF16* target = *targetStart;
    while (source < sourceEnd) {
        UTF32 ch = 0;
        unsigned short extraBytesToRead = trailingBytesForUTF8[*source];
        if (extraBytesToRead >= sourceEnd - source) {
            result = sourceExhausted; break;
        }
        /* Do this check whether lenient or strict */
        if (!isLegalUTF8(source, extraBytesToRead+1)) {
            result = sourceIllegal;
            break;
        }
        /*
         * The cases all fall through. See "Note A" below.
         */
        switch (extraBytesToRead) {
            case 5: ch += *source++; ch <<= 6; /* remember, illegal UTF-8 */
            case 4: ch += *source++; ch <<= 6; /* remember, illegal UTF-8 */
            case 3: ch += *source++; ch <<= 6;
            case 2: ch += *source++; ch <<= 6;
            case 1: ch += *source++; ch <<= 6;
            case 0: ch += *source++;
        }
        ch -= offsetsFromUTF8[extraBytesToRead];

        if (target >= targetEnd) {
            source -= (extraBytesToRead+1); /* Back up source pointer! */
            result = targetExhausted; break;
        }
        if (ch <= UNI_MAX_BMP) { /* Target is a character <= 0xFFFF */
            /* UTF-16 surrogate values are illegal in UTF-32 */
            if (ch >= UNI_SUR_HIGH_START && ch <= UNI_SUR_LOW_END) {
                if (flags == strictConversion) {
                    source -= (extraBytesToRead+1); /* return to the illegal value itself */
                    result = sourceIllegal;
                    break;
                } else {
                    *target++ = UNI_REPLACEMENT_CHAR;
                }
            } else {
                *target++ = (UTF16)ch; /* normal case */
            }
        } else if (ch > UNI_MAX_UTF16) {
            if (flags == strictConversion) {
                result = sourceIllegal;
                source -= (extraBytesToRead+1); /* return to the start */
                break; /* Bail out; shouldn't continue */
            } else {
                *target++ = UNI_REPLACEMENT_CHAR;
            }
        } else {
            /* target is a character in range 0xFFFF - 0x10FFFF. */
            if (target + 1 >= targetEnd) {
                source -= (extraBytesToRead+1); /* Back up source pointer! */
                result = targetExhausted; break;
            }
            ch -= halfBase;
            *target++ = (UTF16)((ch >> halfShift) + UNI_SUR_HIGH_START);
            *target++ = (UTF16)((ch & halfMask) + UNI_SUR_LOW_START);
        }
    }
    *sourceStart = source;
    *targetStart = target;
    return result;
}